

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu.c
# Opt level: O0

uint32_t read_and_decode_one_tile_list
                   (AV1Decoder *pbi,aom_read_bit_buffer *rb,uint8_t *data,uint8_t *data_end,
                   uint8_t **p_data_end,int *frame_decoding_finished)

{
  undefined4 uVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  uint8_t *data_end_00;
  uint8_t **in_RCX;
  long in_RDX;
  long *in_RSI;
  AV1Decoder *in_RDI;
  AV1Decoder *in_R8;
  undefined4 *in_R9;
  int unaff_retaddr;
  undefined4 unaff_retaddr_00;
  uint32_t tile_payload_size;
  int ref_idx;
  uint32_t tile_info_bytes;
  int tile_idx;
  uint32_t tile_list_info_bytes;
  int tile_height_in_pixels;
  int tile_width_in_pixels;
  int tile_height;
  int tile_width;
  int i;
  int end_tile;
  int start_tile;
  int num_tiles;
  uint32_t tile_list_payload_size;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffff7c;
  aom_read_bit_buffer *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  uint use_external_ref;
  int idx;
  undefined4 uVar5;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  undefined4 local_4c;
  int local_48;
  uint32_t local_44;
  AV1_COMMON *local_40;
  int in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  
  local_40 = &in_RDI->common;
  local_44 = 0;
  local_48 = (in_RDI->common).tiles.cols * (in_RDI->common).tiles.rows;
  local_4c = 0;
  local_50 = local_48 + -1;
  local_54 = 0;
  iVar3 = aom_rb_read_literal(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  in_RDI->output_frame_width_in_tiles_minus_1 = iVar3;
  iVar3 = aom_rb_read_literal(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  in_RDI->output_frame_height_in_tiles_minus_1 = iVar3;
  iVar3 = aom_rb_read_literal(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  in_RDI->tile_count_minus_1 = iVar3;
  if ((in_RDI->output_frame_width_in_tiles_minus_1 + 1) *
      (in_RDI->output_frame_height_in_tiles_minus_1 + 1) < in_RDI->tile_count_minus_1 + 1) {
    (in_RDI->error).error_code = AOM_CODEC_CORRUPT_FRAME;
    local_44 = 0;
  }
  else if (in_RDI->tile_count_minus_1 < 0x200) {
    _Var2 = av1_get_uniform_tile_size(local_40,&local_58,&local_5c);
    if (_Var2) {
      iVar3 = local_5c << 2;
      alloc_tile_list_buffer(in_R8,(int)((ulong)in_R9 >> 0x20),(int)in_R9);
      uVar5 = 4;
      local_44 = local_44 + 4;
      in_RDX = in_RDX + 4;
      idx = 0;
      for (local_54 = 0; local_54 <= in_RDI->tile_count_minus_1; local_54 = local_54 + 1) {
        *(undefined4 *)(in_RSI + 2) = 0;
        *in_RSI = in_RDX;
        use_external_ref = 5;
        iVar4 = aom_rb_read_literal(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        if (0x7f < iVar4) {
          (in_RDI->error).error_code = AOM_CODEC_CORRUPT_FRAME;
          return 0;
        }
        av1_set_reference_dec
                  ((AV1_COMMON *)CONCAT44(iVar3,uVar5),idx,use_external_ref,
                   (YV12_BUFFER_CONFIG *)CONCAT44(iVar4,in_stack_ffffffffffffff88));
        iVar4 = aom_rb_read_literal(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        in_RDI->dec_tile_row = iVar4;
        iVar4 = aom_rb_read_literal(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        in_RDI->dec_tile_col = iVar4;
        if ((((in_RDI->dec_tile_row < 0) || (in_RDI->dec_tile_col < 0)) ||
            ((local_40->tiles).rows <= in_RDI->dec_tile_row)) ||
           ((local_40->tiles).cols <= in_RDI->dec_tile_col)) {
          (in_RDI->error).error_code = AOM_CODEC_CORRUPT_FRAME;
          return 0;
        }
        iVar4 = aom_rb_read_literal(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        in_RDI->coded_tile_data_size = iVar4 + 1;
        data_end_00 = (uint8_t *)(in_RDX + (ulong)use_external_ref);
        if ((ulong)((long)in_RCX - (long)data_end_00) < (ulong)in_RDI->coded_tile_data_size) {
          (in_RDI->error).error_code = AOM_CODEC_CORRUPT_FRAME;
          return 0;
        }
        av1_decode_tg_tiles_and_wrapup
                  (in_RDI,(uint8_t *)in_RSI,data_end_00,in_RCX,(int)((ulong)in_R8 >> 0x20),
                   (int)in_R8,unaff_retaddr);
        uVar1 = (in_R8->dcb).xd.mi_row;
        in_stack_ffffffffffffff88 = uVar1 - (int)data_end_00;
        local_44 = use_external_ref + in_stack_ffffffffffffff88 + local_44;
        in_RDX._0_4_ = (in_R8->dcb).xd.mi_row;
        in_RDX._4_4_ = (in_R8->dcb).xd.mi_col;
        copy_decoded_tile_to_tile_list_buffer
                  ((AV1Decoder *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc,
                   in_stack_fffffffffffffff8,(int)((ulong)in_RDI >> 0x20));
        idx = idx + 1;
      }
      *in_R9 = 1;
    }
    else {
      (in_RDI->error).error_code = AOM_CODEC_CORRUPT_FRAME;
      local_44 = 0;
    }
  }
  else {
    (in_RDI->error).error_code = AOM_CODEC_CORRUPT_FRAME;
    local_44 = 0;
  }
  return local_44;
}

Assistant:

static uint32_t read_and_decode_one_tile_list(AV1Decoder *pbi,
                                              struct aom_read_bit_buffer *rb,
                                              const uint8_t *data,
                                              const uint8_t *data_end,
                                              const uint8_t **p_data_end,
                                              int *frame_decoding_finished) {
  AV1_COMMON *const cm = &pbi->common;
  uint32_t tile_list_payload_size = 0;
  const int num_tiles = cm->tiles.cols * cm->tiles.rows;
  const int start_tile = 0;
  const int end_tile = num_tiles - 1;
  int i = 0;

  // Process the tile list info.
  pbi->output_frame_width_in_tiles_minus_1 = aom_rb_read_literal(rb, 8);
  pbi->output_frame_height_in_tiles_minus_1 = aom_rb_read_literal(rb, 8);
  pbi->tile_count_minus_1 = aom_rb_read_literal(rb, 16);

  // The output frame is used to store the decoded tile list. The decoded tile
  // list has to fit into 1 output frame.
  if ((pbi->tile_count_minus_1 + 1) >
      (pbi->output_frame_width_in_tiles_minus_1 + 1) *
          (pbi->output_frame_height_in_tiles_minus_1 + 1)) {
    pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
    return 0;
  }

  if (pbi->tile_count_minus_1 > MAX_TILES - 1) {
    pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
    return 0;
  }

  int tile_width, tile_height;
  if (!av1_get_uniform_tile_size(cm, &tile_width, &tile_height)) {
    pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
    return 0;
  }
  const int tile_width_in_pixels = tile_width * MI_SIZE;
  const int tile_height_in_pixels = tile_height * MI_SIZE;

  // Allocate output frame buffer for the tile list.
  alloc_tile_list_buffer(pbi, tile_width_in_pixels, tile_height_in_pixels);

  uint32_t tile_list_info_bytes = 4;
  tile_list_payload_size += tile_list_info_bytes;
  data += tile_list_info_bytes;

  int tile_idx = 0;
  for (i = 0; i <= pbi->tile_count_minus_1; i++) {
    // Process 1 tile.
    // Reset the bit reader.
    rb->bit_offset = 0;
    rb->bit_buffer = data;

    // Read out the tile info.
    uint32_t tile_info_bytes = 5;
    // Set reference for each tile.
    int ref_idx = aom_rb_read_literal(rb, 8);
    if (ref_idx >= MAX_EXTERNAL_REFERENCES) {
      pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
      return 0;
    }
    av1_set_reference_dec(cm, cm->remapped_ref_idx[0], 1,
                          &pbi->ext_refs.refs[ref_idx]);

    pbi->dec_tile_row = aom_rb_read_literal(rb, 8);
    pbi->dec_tile_col = aom_rb_read_literal(rb, 8);
    if (pbi->dec_tile_row < 0 || pbi->dec_tile_col < 0 ||
        pbi->dec_tile_row >= cm->tiles.rows ||
        pbi->dec_tile_col >= cm->tiles.cols) {
      pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
      return 0;
    }

    pbi->coded_tile_data_size = aom_rb_read_literal(rb, 16) + 1;
    data += tile_info_bytes;
    if ((size_t)(data_end - data) < pbi->coded_tile_data_size) {
      pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
      return 0;
    }

    av1_decode_tg_tiles_and_wrapup(pbi, data, data + pbi->coded_tile_data_size,
                                   p_data_end, start_tile, end_tile, 0);
    uint32_t tile_payload_size = (uint32_t)(*p_data_end - data);

    tile_list_payload_size += tile_info_bytes + tile_payload_size;

    // Update data ptr for next tile decoding.
    data = *p_data_end;
    assert(data <= data_end);

    // Copy the decoded tile to the tile list output buffer.
    copy_decoded_tile_to_tile_list_buffer(pbi, tile_idx, tile_width_in_pixels,
                                          tile_height_in_pixels);
    tile_idx++;
  }

  *frame_decoding_finished = 1;
  return tile_list_payload_size;
}